

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.h
# Opt level: O3

BOOL Js::CrossSite::IsCrossSiteObjectTyped<Js::JavascriptNativeIntArray>
               (JavascriptNativeIntArray *obj)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  IRecyclerVisitedObject IVar5;
  uint uVar6;
  bool bVar7;
  
  IVar5._vptr_IRecyclerVisitedObject =
       (obj->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  bVar7 = IVar5._vptr_IRecyclerVisitedObject ==
          (_func_int **)
          VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address;
  if ((!bVar7) &&
     (IVar5._vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                ,0x1c,"(ret || VirtualTableInfo<T>::HasVirtualTable(obj))",
                                "ret || VirtualTableInfo<T>::HasVirtualTable(obj)");
    if (!bVar2) goto LAB_00ade48f;
    *puVar4 = 0;
    IVar5._vptr_IRecyclerVisitedObject =
         (obj->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
         super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  }
  uVar3 = (*IVar5._vptr_IRecyclerVisitedObject[0x66])(obj);
  uVar6 = (uint)bVar7;
  if (uVar3 != uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                ,0x1d,"(ret == obj->IsCrossSiteObject())",
                                "ret == obj->IsCrossSiteObject()");
    if (!bVar7) {
LAB_00ade48f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return uVar6;
}

Assistant:

static BOOL IsCrossSiteObjectTyped(T * obj)
        {
            BOOL ret = VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(obj);
            Assert(ret || VirtualTableInfo<T>::HasVirtualTable(obj));
            Assert(ret == obj->IsCrossSiteObject());
            return ret;
        }